

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

double __thiscall
tetgenmesh::insphere_s(tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *pe)

{
  point pdVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int local_a0;
  int local_9c;
  int i;
  int n;
  int count;
  int swaps;
  double oriB;
  double oriA;
  point swappt;
  point pt [5];
  double sign;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  tetgenmesh *this_local;
  
  this_local = (tetgenmesh *)insphere(pa,pb,pc,pd,pe);
  if (((double)this_local == 0.0) && (!NAN((double)this_local))) {
    pt[0] = pb;
    pt[1] = pc;
    pt[2] = pd;
    pt[3] = pe;
    n = 0;
    local_9c = 5;
    do {
      i = 0;
      local_9c = local_9c + -1;
      for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
        iVar2 = pointmark(this,pt[(long)local_a0 + -1]);
        iVar3 = pointmark(this,pt[(long)(local_a0 + 1) + -1]);
        if (iVar3 < iVar2) {
          pdVar1 = pt[(long)local_a0 + -1];
          pt[(long)local_a0 + -1] = pt[(long)(local_a0 + 1) + -1];
          pt[(long)(local_a0 + 1) + -1] = pdVar1;
          i = i + 1;
        }
      }
      n = i + n;
    } while (0 < i);
    oriB = orient3d(pt[0],pt[1],pt[2],pt[3]);
    if ((oriB != 0.0) || (NAN(oriB))) {
      if (n % 2 != 0) {
        oriB = -oriB;
      }
      this_local = (tetgenmesh *)oriB;
    }
    else {
      dVar4 = orient3d(pa,pt[1],pt[2],pt[3]);
      _count = (tetgenmesh *)-dVar4;
      if (((double)_count == 0.0) && (!NAN((double)_count))) {
        terminatetetgen(this,2);
      }
      if (n % 2 != 0) {
        _count = (tetgenmesh *)-(double)_count;
      }
      this_local = _count;
    }
  }
  return (double)this_local;
}

Assistant:

REAL tetgenmesh::insphere_s(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe)
{
  REAL sign;

  sign = insphere(pa, pb, pc, pd, pe);
  if (sign != 0.0) {
    return sign;
  }

  // Symbolic perturbation.
  point pt[5], swappt;
  REAL oriA, oriB;
  int swaps, count;
  int n, i;

  pt[0] = pa;
  pt[1] = pb;
  pt[2] = pc;
  pt[3] = pd;
  pt[4] = pe;
  
  // Sort the five points such that their indices are in the increasing
  //   order. An optimized bubble sort algorithm is used, i.e., it has
  //   the worst case O(n^2) runtime, but it is usually much faster.
  swaps = 0; // Record the total number of swaps.
  n = 5;
  do {
    count = 0;
    n = n - 1;
    for (i = 0; i < n; i++) {
      if (pointmark(pt[i]) > pointmark(pt[i+1])) {
        swappt = pt[i]; pt[i] = pt[i+1]; pt[i+1] = swappt;
        count++;
      }
    }
    swaps += count;
  } while (count > 0); // Continue if some points are swapped.

  oriA = orient3d(pt[1], pt[2], pt[3], pt[4]);
  if (oriA != 0.0) {
    // Flip the sign if there are odd number of swaps.
    if ((swaps % 2) != 0) oriA = -oriA;
    return oriA;
  }
  
  oriB = -orient3d(pt[0], pt[2], pt[3], pt[4]);
  if (oriB == 0.0) {
    terminatetetgen(this, 2);
  }
  // Flip the sign if there are odd number of swaps.
  if ((swaps % 2) != 0) oriB = -oriB;
  return oriB;
}